

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnDisarm
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,string_view object,
          PlayerInfo *victim)

{
  bool bVar1;
  __sv_type _Var2;
  undefined1 auVar3 [16];
  code *local_f8;
  size_t local_c8;
  char *local_c0;
  size_t local_98;
  char *local_90;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  undefined1 local_68 [8];
  string msg;
  logFuncType func;
  PlayerInfo *victim_local;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  string_view object_local;
  
  std::__cxx11::string::string((string *)local_68);
  local_78._M_len = object._M_len;
  local_78._M_str = object._M_str;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with(&local_78,"Beacon");
  if (bVar1) {
    if ((*(ulong *)&this->field_0xa0 >> 0x15 & 1) == 0) {
      msg.field_2._8_8_ = RenX::Server::sendAdmChan;
    }
    else {
      msg.field_2._8_8_ = RenX::Server::sendLogChan;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               &this->disarmFmt);
  }
  else {
    if ((*(ulong *)&this->field_0xa0 >> 0x16 & 1) == 0) {
      msg.field_2._8_8_ = RenX::Server::sendAdmChan;
    }
    else {
      msg.field_2._8_8_ = RenX::Server::sendLogChan;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               &this->mineDisarmFmt);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  if (!bVar1) {
    RenX::processTags((string *)local_68,server,player,victim,(BuildingInfo *)0x0);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(RenX::tags + 0x14e8));
    auVar3 = RenX::translateName(object._M_len,object._M_str);
    local_98 = _Var2._M_len;
    local_90 = _Var2._M_str;
    RenX::replace_tag(local_68,local_98,local_90,auVar3._0_8_,auVar3._8_8_);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_f8 = (code *)msg.field_2._8_8_;
    }
    else {
      local_f8 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    local_c8 = _Var2._M_len;
    local_c0 = _Var2._M_str;
    (*local_f8)(server,local_c8,local_c0);
  }
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnDisarm(RenX::Server &server, const RenX::PlayerInfo &player, std::string_view object, const RenX::PlayerInfo &victim) {
	logFuncType func;
	std::string msg;

	if (std::string_view{object}.ends_with("Beacon")) {
		if (RenX_LoggingPlugin::disarmPublic)
			func = &RenX::Server::sendLogChan;
		else
			func = &RenX::Server::sendAdmChan;

		msg = this->disarmFmt;
	}
	else {
		if (RenX_LoggingPlugin::mineDisarmPublic)
			func = &RenX::Server::sendLogChan;
		else
			func = &RenX::Server::sendAdmChan;

		msg = this->mineDisarmFmt;
	}
	if (!msg.empty()) {
		RenX::processTags(msg, &server, &player, &victim);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, RenX::translateName(object));
		(server.*func)(msg);
	}
}